

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Kinematics.cc
# Opt level: O0

uint __thiscall
RigidBodyDynamics::InverseKinematicsConstraintSet::AddFullConstraint
          (InverseKinematicsConstraintSet *this,uint body_id,Vector3d *body_point,
          Vector3d *target_pos,Matrix3d *target_orientation,float weight)

{
  size_type sVar1;
  vector<Matrix3_t,_std::allocator<Matrix3_t>_> *in_RCX;
  value_type *in_RDI;
  value_type *in_R8;
  undefined4 in_XMM0_Da;
  
  std::
  vector<RigidBodyDynamics::InverseKinematicsConstraintSet::ConstraintType,_std::allocator<RigidBodyDynamics::InverseKinematicsConstraintSet::ConstraintType>_>
  ::push_back((vector<RigidBodyDynamics::InverseKinematicsConstraintSet::ConstraintType,_std::allocator<RigidBodyDynamics::InverseKinematicsConstraintSet::ConstraintType>_>
               *)CONCAT44(in_XMM0_Da,2),in_RDI);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_RCX,
             (value_type_conflict *)in_R8);
  std::vector<Vector3_t,_std::allocator<Vector3_t>_>::push_back
            ((vector<Vector3_t,_std::allocator<Vector3_t>_> *)in_RCX,(value_type *)in_R8);
  std::vector<Vector3_t,_std::allocator<Vector3_t>_>::push_back
            ((vector<Vector3_t,_std::allocator<Vector3_t>_> *)in_RCX,(value_type *)in_R8);
  std::vector<Matrix3_t,_std::allocator<Matrix3_t>_>::push_back(in_RCX,in_R8);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_RCX,
             (value_type_conflict *)in_R8);
  std::vector<float,_std::allocator<float>_>::push_back
            ((vector<float,_std::allocator<float>_> *)in_RCX,(value_type_conflict3 *)in_R8);
  in_RDI[0x10] = in_RDI[0x10] + (ConstraintTypePositionZ|ConstraintTypeFull);
  sVar1 = std::
          vector<RigidBodyDynamics::InverseKinematicsConstraintSet::ConstraintType,_std::allocator<RigidBodyDynamics::InverseKinematicsConstraintSet::ConstraintType>_>
          ::size((vector<RigidBodyDynamics::InverseKinematicsConstraintSet::ConstraintType,_std::allocator<RigidBodyDynamics::InverseKinematicsConstraintSet::ConstraintType>_>
                  *)(in_RDI + 0x1e));
  return (int)sVar1 - 1;
}

Assistant:

RBDL_DLLAPI
unsigned int InverseKinematicsConstraintSet::AddFullConstraint(
    unsigned int body_id,
    const Vector3d& body_point,
    const Vector3d& target_pos,
    const Matrix3d& target_orientation,
    float weight
    ) {
  constraint_type.push_back (ConstraintTypeFull);
  body_ids.push_back(body_id);
  body_points.push_back(body_point);
  target_positions.push_back(target_pos);
  target_orientations.push_back(target_orientation);
  constraint_row_index.push_back(num_constraints);
  constraint_weight.push_back(weight);
  num_constraints = num_constraints + 6;
  return constraint_type.size() - 1;
}